

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

void __thiscall
tetgenmesh::interecursive
          (tetgenmesh *this,shellface **subfacearray,int arraysize,int axis,double bxmin,
          double bxmax,double bymin,double bymax,double bzmin,double bzmax,int *internum)

{
  ulong uVar1;
  uint *puVar2;
  shellface *pppdVar3;
  shellface A;
  shellface B;
  shellface C;
  shellface *pppdVar4;
  shellface O;
  shellface P;
  shellface Q;
  bool bVar5;
  bool bVar6;
  shellface **subfacearray_00;
  long lVar7;
  char *pcVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  double dVar13;
  shellface ppdVar14;
  double local_90;
  double local_88;
  ulong local_78;
  shellface **local_70;
  shellface **local_68;
  undefined4 uVar15;
  
  local_90 = bymin;
  local_88 = bzmin;
  do {
    uVar9 = arraysize;
    local_70 = subfacearray;
    while( true ) {
      uVar12 = (ulong)uVar9;
      if (2 < this->b->verbose) {
        pcVar8 = "z";
        if (axis == 1) {
          pcVar8 = "y";
        }
        if (axis == 0) {
          pcVar8 = "x";
        }
        printf("      Recur %d faces. Bbox (%g, %g, %g),(%g, %g, %g). %s-axis\n",bxmin,local_90,
               local_88,bxmax,bymax,bzmax,uVar12,pcVar8);
      }
      uVar10 = (long)(int)uVar9 << 3;
      if ((int)uVar9 < 0) {
        uVar10 = 0xffffffffffffffff;
      }
      subfacearray_00 = (shellface **)operator_new__(uVar10);
      subfacearray = (shellface **)operator_new__(uVar10);
      dVar13 = bxmin + bxmax;
      if (axis != 0) {
        if (axis == 1) {
          dVar13 = local_90 + bymax;
        }
        else {
          dVar13 = local_88 + bzmax;
        }
      }
      dVar13 = dVar13 * 0.5;
      iVar11 = 0;
      arraysize = 0;
      if (0 < (int)uVar9) {
        uVar10 = 0;
        iVar11 = 0;
        do {
          pppdVar3 = local_70[uVar10];
          if (dVar13 <= (double)pppdVar3[3][axis]) {
            bVar6 = true;
            if ((((double)pppdVar3[3][axis] <= dVar13) || ((double)pppdVar3[4][axis] <= dVar13)) ||
               ((double)pppdVar3[5][axis] <= dVar13)) {
              bVar5 = true;
            }
            else {
              bVar5 = false;
            }
          }
          else if ((dVar13 <= (double)pppdVar3[4][axis]) || (dVar13 <= (double)pppdVar3[5][axis])) {
            bVar5 = true;
            bVar6 = true;
          }
          else {
            bVar5 = true;
            bVar6 = false;
          }
          if (bVar5) {
            subfacearray_00[iVar11] = pppdVar3;
            iVar11 = iVar11 + 1;
          }
          if (bVar6) {
            subfacearray[arraysize] = pppdVar3;
            arraysize = arraysize + 1;
          }
          uVar10 = uVar10 + 1;
        } while (uVar12 != uVar10);
      }
      if (((int)uVar9 <= iVar11) || ((int)uVar9 <= arraysize)) {
        if (1 < this->b->verbose) {
          puts("  Checking intersecting faces.");
        }
        if (0 < (int)uVar9) {
          local_68 = local_70;
          uVar10 = 0;
          local_78 = uVar12;
          do {
            uVar1 = uVar10 + 1;
            if (uVar1 < uVar12) {
              pppdVar3 = local_70[uVar10];
              A = pppdVar3[3];
              B = pppdVar3[4];
              C = pppdVar3[5];
              uVar10 = 1;
              do {
                pppdVar4 = local_68[uVar10];
                O = pppdVar4[3];
                P = pppdVar4[4];
                Q = pppdVar4[5];
                ppdVar14 = Q;
                iVar11 = tri_tri_inter(this,(double *)A,(double *)B,(double *)C,(double *)O,
                                       (double *)P,(double *)Q);
                uVar15 = (undefined4)((ulong)ppdVar14 >> 0x20);
                if ((iVar11 == 4) || (iVar11 == 1)) {
                  if (this->b->quiet == 0) {
                    pcVar8 = "  Facet #%d intersects facet #%d at triangles:\n";
                    if (iVar11 != 1) {
                      pcVar8 = "  Facet #%d duplicates facet #%d at triangle:\n";
                    }
                    printf(pcVar8,(ulong)*(uint *)((long)pppdVar3 + (long)this->shmarkindex * 4),
                           (ulong)*(uint *)((long)pppdVar4 + (long)this->shmarkindex * 4));
                    lVar7 = (long)this->pointmarkindex;
                    printf("    (%4d, %4d, %4d) and (%4d, %4d, %4d)\n",
                           (ulong)*(uint *)((long)A + lVar7 * 4),
                           (ulong)*(uint *)((long)B + lVar7 * 4),
                           (ulong)*(uint *)((long)C + lVar7 * 4),
                           (ulong)*(uint *)((long)O + lVar7 * 4),
                           (ulong)*(uint *)((long)P + lVar7 * 4),
                           CONCAT44(uVar15,*(undefined4 *)((long)Q + lVar7 * 4)));
                  }
                  *internum = *internum + 1;
                  puVar2 = (uint *)((long)pppdVar3 + (long)this->shmarkindex * 4 + 4);
                  *puVar2 = *puVar2 | 1;
                  puVar2 = (uint *)((long)pppdVar4 + (long)this->shmarkindex * 4 + 4);
                  *puVar2 = *puVar2 | 1;
                }
                uVar10 = uVar10 + 1;
              } while (local_78 != uVar10);
            }
            local_68 = local_68 + 1;
            local_78 = local_78 - 1;
            uVar10 = uVar1;
          } while (uVar1 != uVar12);
        }
        operator_delete__(subfacearray_00);
        operator_delete__(subfacearray);
        if (local_70 == (shellface **)0x0) {
          return;
        }
        operator_delete__(local_70);
        return;
      }
      if (local_70 != (shellface **)0x0) {
        operator_delete__(local_70);
      }
      if (axis == 0) break;
      uVar9 = arraysize;
      local_70 = subfacearray;
      if (axis == 1) {
        axis = 2;
        interecursive(this,subfacearray_00,iVar11,2,bxmin,bxmax,local_90,dVar13,local_88,bzmax,
                      internum);
        local_90 = dVar13;
      }
      else {
        axis = 0;
        interecursive(this,subfacearray_00,iVar11,0,bxmin,bxmax,local_90,bymax,local_88,dVar13,
                      internum);
        local_88 = dVar13;
      }
    }
    axis = 1;
    interecursive(this,subfacearray_00,iVar11,1,bxmin,dVar13,local_90,bymax,local_88,bzmax,internum)
    ;
    bxmin = dVar13;
  } while( true );
}

Assistant:

void tetgenmesh::interecursive(shellface** subfacearray, int arraysize, 
                               int axis, REAL bxmin, REAL bxmax, REAL bymin, 
                               REAL bymax, REAL bzmin, REAL bzmax, 
                               int* internum)
{
  shellface **leftarray, **rightarray;
  face sface1, sface2;
  point p1, p2, p3;
  point p4, p5, p6;
  enum interresult intersect;
  REAL split;
  bool toleft, toright;
  int leftsize, rightsize;
  int i, j;

  if (b->verbose > 2) {
    printf("      Recur %d faces. Bbox (%g, %g, %g),(%g, %g, %g). %s-axis\n",
           arraysize, bxmin, bymin, bzmin, bxmax, bymax, bzmax,
           axis == 0 ? "x" : (axis == 1 ? "y" : "z"));
  }
    
  leftarray = new shellface*[arraysize];
  if (leftarray == NULL) {
    terminatetetgen(this, 1);
  }
  rightarray = new shellface*[arraysize];
  if (rightarray == NULL) {
    terminatetetgen(this, 1);
  }
  leftsize = rightsize = 0;

  if (axis == 0) {
    // Split along x-axis.
    split = 0.5 * (bxmin + bxmax);
  } else if (axis == 1) {
    // Split along y-axis.
    split = 0.5 * (bymin + bymax);
  } else {
    // Split along z-axis.
    split = 0.5 * (bzmin + bzmax);
  }

  for (i = 0; i < arraysize; i++) {
    sface1.sh = subfacearray[i];
    p1 = (point) sface1.sh[3];
    p2 = (point) sface1.sh[4];
    p3 = (point) sface1.sh[5];
    toleft = toright = false;
    if (p1[axis] < split) {
      toleft = true;
      if (p2[axis] >= split || p3[axis] >= split) {
        toright = true;
      } 
    } else if (p1[axis] > split) {
      toright = true;
      if (p2[axis] <= split || p3[axis] <= split) {
        toleft = true;
      } 
    } else {
      // p1[axis] == split;
      toleft = true;
      toright = true;
    }
    if (toleft) {
      leftarray[leftsize] = sface1.sh;
      leftsize++;
    }
    if (toright) {
      rightarray[rightsize] = sface1.sh;
      rightsize++;
    }
  }

  if (leftsize < arraysize && rightsize < arraysize) {
    // Continue to partition the input set. Now 'subfacearray' has been
    //   split into two sets, it's memory can be freed. 'leftarray' and
    //   'rightarray' will be freed in the next recursive (after they're
    //   partitioned again or performing tests).
    delete [] subfacearray;
    // Continue to split these two sets.
    if (axis == 0) {
      interecursive(leftarray, leftsize, 1, bxmin, split, bymin, bymax,
                    bzmin, bzmax, internum);
      interecursive(rightarray, rightsize, 1, split, bxmax, bymin, bymax,
                    bzmin, bzmax, internum);
    } else if (axis == 1) {
      interecursive(leftarray, leftsize, 2, bxmin, bxmax, bymin, split,
                    bzmin, bzmax, internum);
      interecursive(rightarray, rightsize, 2, bxmin, bxmax, split, bymax,
                    bzmin, bzmax, internum);
    } else {
      interecursive(leftarray, leftsize, 0, bxmin, bxmax, bymin, bymax,
                    bzmin, split, internum);
      interecursive(rightarray, rightsize, 0, bxmin, bxmax, bymin, bymax,
                    split, bzmax, internum);
    }
  } else {
    if (b->verbose > 1) {
      printf("  Checking intersecting faces.\n");
    }
    // Perform a brute-force compare on the set.
    for (i = 0; i < arraysize; i++) {
      sface1.sh = subfacearray[i];
      p1 = (point) sface1.sh[3];
      p2 = (point) sface1.sh[4];
      p3 = (point) sface1.sh[5];
      for (j = i + 1; j < arraysize; j++) {
        sface2.sh = subfacearray[j];
        p4 = (point) sface2.sh[3];
        p5 = (point) sface2.sh[4];
        p6 = (point) sface2.sh[5];
        intersect = (enum interresult) tri_tri_inter(p1, p2, p3, p4, p5, p6);
        if (intersect == INTERSECT || intersect == SHAREFACE) {
          if (!b->quiet) {
            if (intersect == INTERSECT) {
              printf("  Facet #%d intersects facet #%d at triangles:\n",
                     shellmark(sface1), shellmark(sface2));
              printf("    (%4d, %4d, %4d) and (%4d, %4d, %4d)\n",
                     pointmark(p1), pointmark(p2), pointmark(p3),
                     pointmark(p4), pointmark(p5), pointmark(p6));
            } else {
              printf("  Facet #%d duplicates facet #%d at triangle:\n",
                     shellmark(sface1), shellmark(sface2));
              printf("    (%4d, %4d, %4d) and (%4d, %4d, %4d)\n",
                     pointmark(p1), pointmark(p2), pointmark(p3),
                     pointmark(p4), pointmark(p5), pointmark(p6));
            }
          }
          // Increase the number of intersecting pairs.
          (*internum)++; 
          // Infect these two faces (although they may already be infected).
          sinfect(sface1);
          sinfect(sface2);
        }
      }
    }
    // Don't forget to free all three arrays. No further partition.
    delete [] leftarray;
    delete [] rightarray;  
    delete [] subfacearray;
  }
}